

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall QDomNodePrivate::~QDomNodePrivate(QDomNodePrivate *this)

{
  QDomNodePrivate *pQVar1;
  bool bVar2;
  QDomNodePrivate *in_RDI;
  QDomNodePrivate *n;
  QDomNodePrivate *p;
  QDomNodePrivate *local_10;
  
  in_RDI->_vptr_QDomNodePrivate = (_func_int **)&PTR__QDomNodePrivate_00145eb0;
  pQVar1 = in_RDI->first;
  while (local_10 = pQVar1, local_10 != (QDomNodePrivate *)0x0) {
    pQVar1 = local_10->next;
    bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x10ed51);
    if (bVar2) {
      setNoParent(in_RDI);
    }
    else if (local_10 != (QDomNodePrivate *)0x0) {
      (*local_10->_vptr_QDomNodePrivate[1])();
    }
  }
  in_RDI->first = (QDomNodePrivate *)0x0;
  in_RDI->last = (QDomNodePrivate *)0x0;
  QString::~QString((QString *)0x10eda7);
  QString::~QString((QString *)0x10edb5);
  QString::~QString((QString *)0x10edc3);
  QString::~QString((QString *)0x10edd1);
  return;
}

Assistant:

QDomNodePrivate::~QDomNodePrivate()
{
    QDomNodePrivate* p = first;
    QDomNodePrivate* n;

    while (p) {
        n = p->next;
        if (!p->ref.deref())
            delete p;
        else
            p->setNoParent();
        p = n;
    }
    first = nullptr;
    last = nullptr;
}